

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_mb.cpp
# Opt level: O2

void __thiscall embree::avx::BVHNBuilderMBlurSAHGrid<8>::build(BVHNBuilderMBlurSAHGrid<8> *this)

{
  BVHN<8> *this_00;
  EVP_PKEY_CTX *ctx;
  double t0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  this_00 = this->bvh;
  ctx = (EVP_PKEY_CTX *)(this->scene->world).numMBGrids;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    std::__cxx11::to_string(&local_40,8);
    std::operator+(&local_80,"avx::BVH",&local_40);
    std::operator+(&local_60,&local_80,"BuilderMBlurSAHGrid");
    t0 = BVHN<8>::preBuild(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    buildMultiSegment(this,(size_t)ctx);
    BVHN<8>::cleanup(this->bvh,ctx);
    BVHN<8>::postBuild(this->bvh,t0);
    return;
  }
  (*(this_00->super_AccelData).super_RefCount._vptr_RefCount[5])(this_00);
  return;
}

Assistant:

void build()
      {
	/* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(GridMesh::geom_type,true);
        if (numPrimitives == 0) { bvh->clear(); return; }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "BuilderMBlurSAHGrid");

        //const size_t numTimeSteps = scene->getNumTimeSteps<GridMesh,true>();
        //const size_t numTimeSegments = numTimeSteps-1; assert(numTimeSteps > 1);
        //if (numTimeSegments == 1)
        //  buildSingleSegment(numPrimitives);
        //else
        buildMultiSegment(numPrimitives);

	/* clear temporary data for static geometry */
	bvh->cleanup();
        bvh->postBuild(t0);
      }